

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O2

void __thiscall
pbrt::StatRegisterer::StatRegisterer(StatRegisterer *this,AccumFunc func,PixelAccumFunc pfunc)

{
  vector<void_(*)(pbrt::StatsAccumulator_&),_std::allocator<void_(*)(pbrt::StatsAccumulator_&)>_>
  *this_00;
  vector<void_(*)(const_pbrt::Point2<int>_&,_int,_pbrt::PixelStatsAccumulator_&),_std::allocator<void_(*)(const_pbrt::Point2<int>_&,_int,_pbrt::PixelStatsAccumulator_&)>_>
  *this_01;
  PixelAccumFunc pfunc_local;
  AccumFunc func_local;
  
  pfunc_local = pfunc;
  func_local = func;
  std::mutex::lock(&StatRegisterer::mutex);
  this_00 = statFuncs;
  if (statFuncs ==
      (vector<void_(*)(pbrt::StatsAccumulator_&),_std::allocator<void_(*)(pbrt::StatsAccumulator_&)>_>
       *)0x0) {
    this_00 = (vector<void_(*)(pbrt::StatsAccumulator_&),_std::allocator<void_(*)(pbrt::StatsAccumulator_&)>_>
               *)operator_new(0x18);
    (this_00->
    super__Vector_base<void_(*)(pbrt::StatsAccumulator_&),_std::allocator<void_(*)(pbrt::StatsAccumulator_&)>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    statFuncs = this_00;
    (this_00->
    super__Vector_base<void_(*)(pbrt::StatsAccumulator_&),_std::allocator<void_(*)(pbrt::StatsAccumulator_&)>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->
    super__Vector_base<void_(*)(pbrt::StatsAccumulator_&),_std::allocator<void_(*)(pbrt::StatsAccumulator_&)>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  if (func != (AccumFunc)0x0) {
    std::
    vector<void_(*)(pbrt::StatsAccumulator_&),_std::allocator<void_(*)(pbrt::StatsAccumulator_&)>_>
    ::push_back(this_00,&func_local);
  }
  this_01 = pixelStatFuncs;
  if (pixelStatFuncs ==
      (vector<void_(*)(const_pbrt::Point2<int>_&,_int,_pbrt::PixelStatsAccumulator_&),_std::allocator<void_(*)(const_pbrt::Point2<int>_&,_int,_pbrt::PixelStatsAccumulator_&)>_>
       *)0x0) {
    this_01 = (vector<void_(*)(const_pbrt::Point2<int>_&,_int,_pbrt::PixelStatsAccumulator_&),_std::allocator<void_(*)(const_pbrt::Point2<int>_&,_int,_pbrt::PixelStatsAccumulator_&)>_>
               *)operator_new(0x18);
    (this_01->
    super__Vector_base<void_(*)(const_pbrt::Point2<int>_&,_int,_pbrt::PixelStatsAccumulator_&),_std::allocator<void_(*)(const_pbrt::Point2<int>_&,_int,_pbrt::PixelStatsAccumulator_&)>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pixelStatFuncs = this_01;
    (this_01->
    super__Vector_base<void_(*)(const_pbrt::Point2<int>_&,_int,_pbrt::PixelStatsAccumulator_&),_std::allocator<void_(*)(const_pbrt::Point2<int>_&,_int,_pbrt::PixelStatsAccumulator_&)>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this_01->
    super__Vector_base<void_(*)(const_pbrt::Point2<int>_&,_int,_pbrt::PixelStatsAccumulator_&),_std::allocator<void_(*)(const_pbrt::Point2<int>_&,_int,_pbrt::PixelStatsAccumulator_&)>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  if (pfunc != (PixelAccumFunc)0x0) {
    std::
    vector<void_(*)(const_pbrt::Point2<int>_&,_int,_pbrt::PixelStatsAccumulator_&),_std::allocator<void_(*)(const_pbrt::Point2<int>_&,_int,_pbrt::PixelStatsAccumulator_&)>_>
    ::push_back(this_01,(value_type *)&pfunc_local);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&StatRegisterer::mutex);
  return;
}

Assistant:

StatRegisterer::StatRegisterer(AccumFunc func, PixelAccumFunc pfunc) {
    static std::mutex mutex;
    std::lock_guard<std::mutex> lock(mutex);

    if (statFuncs == nullptr)
        statFuncs = new std::vector<AccumFunc>;
    if (func)
        statFuncs->push_back(func);

    if (pixelStatFuncs == nullptr)
        pixelStatFuncs = new std::vector<PixelAccumFunc>;
    if (pfunc)
        pixelStatFuncs->push_back(pfunc);
}